

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O2

int Ses_StoreGetEntry(Ses_Store_t *pStore,word *pTruth,int nVars,int *pArrTimeProfile,char **pSol)

{
  Ses_TruthEntry_t *pEntry;
  Ses_TimesEntry_t *pTimes2;
  uint uVar1;
  int iVar2;
  char *pcVar3;
  Ses_TruthEntry_t **ppSVar4;
  Ses_TimesEntry_t **ppSVar5;
  int pTimes [8];
  
  uVar1 = Ses_StoreTableHash(pTruth,nVars);
  ppSVar4 = pStore->pEntries + uVar1;
  while( true ) {
    pEntry = *ppSVar4;
    if (pEntry == (Ses_TruthEntry_t *)0x0) {
      return 0;
    }
    iVar2 = Ses_StoreTruthEqual(pEntry,pTruth,nVars);
    if (iVar2 != 0) break;
    ppSVar4 = &pEntry->next;
  }
  ppSVar5 = &pEntry->head;
  pcVar3 = (char *)0x0;
  do {
    pTimes2 = *ppSVar5;
    while( true ) {
      if (pTimes2 == (Ses_TimesEntry_t *)0x0) {
        return 0;
      }
      if (pTimes2->pNetwork == (char *)0x0) break;
      memcpy(pTimes,pArrTimeProfile,(long)nVars << 2);
      Abc_ExactNormalizeArrivalTimesForNetwork(nVars,pTimes,pTimes2->pNetwork);
      iVar2 = Ses_StoreTimesEqual(pTimes,pTimes2->pArrTimeProfile,nVars);
      if (iVar2 != 0) {
        pcVar3 = pTimes2->pNetwork;
        goto LAB_0028095c;
      }
    }
    iVar2 = Ses_StoreTimesEqual(pArrTimeProfile,pTimes2->pArrTimeProfile,nVars);
    if (iVar2 != 0) {
LAB_0028095c:
      *pSol = pcVar3;
      return 1;
    }
    ppSVar5 = &pTimes2->next;
  } while( true );
}

Assistant:

int Ses_StoreGetEntry( Ses_Store_t * pStore, word * pTruth, int nVars, int * pArrTimeProfile, char ** pSol )
{
    int key;
    Ses_TruthEntry_t * pTEntry;
    Ses_TimesEntry_t * pTiEntry;
    int pTimes[8];

    key = Ses_StoreTableHash( pTruth, nVars );
    pTEntry = pStore->pEntries[key];

    /* find truth table entry */
    while ( pTEntry )
    {
        if ( Ses_StoreTruthEqual( pTEntry, pTruth, nVars ) )
            break;
        else
            pTEntry = pTEntry->next;
    }

    /* no entry found? */
    if ( !pTEntry )
        return 0;

    /* find times entry */
    pTiEntry = pTEntry->head;
    while ( pTiEntry )
    {
        /* found after normalization wrt. to network */
        if ( pTiEntry->pNetwork )
        {
            memcpy( pTimes, pArrTimeProfile, sizeof(int) * nVars );
            Abc_ExactNormalizeArrivalTimesForNetwork( nVars, pTimes, pTiEntry->pNetwork );

            if ( Ses_StoreTimesEqual( pTimes, pTiEntry->pArrTimeProfile, nVars ) )
                break;
        }
        /* found for non synthesized network */
        else if ( Ses_StoreTimesEqual( pArrTimeProfile, pTiEntry->pArrTimeProfile, nVars ) )
            break;
        else
            pTiEntry = pTiEntry->next;
    }

    /* no entry found? */
    if ( !pTiEntry )
        return 0;

    *pSol = pTiEntry->pNetwork;
    return 1;
}